

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O1

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::Constraint::Deserialize(Constraint *this,Deserializer *deserializer)

{
  ConstraintType CVar1;
  uint uVar2;
  SerializationException *this_00;
  pointer *__ptr;
  string str;
  _Alloc_hider local_48;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&stack0xffffffffffffffb8,deserializer);
    CVar1 = EnumUtil::FromString<duckdb::ConstraintType>(local_48._M_p);
    uVar2 = (uint)CVar1;
    if (local_48._M_p != &stack0xffffffffffffffc8) {
      operator_delete(local_48._M_p);
    }
  }
  else {
    uVar2 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this->_vptr_Constraint = (_func_int **)0x0;
  switch(uVar2 & 0xff) {
  case 1:
    NotNullConstraint::Deserialize((NotNullConstraint *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 2:
    CheckConstraint::Deserialize((CheckConstraint *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 3:
    UniqueConstraint::Deserialize((UniqueConstraint *)&stack0xffffffffffffffb8,deserializer);
    break;
  case 4:
    ForeignKeyConstraint::Deserialize((ForeignKeyConstraint *)&stack0xffffffffffffffb8,deserializer)
    ;
    break;
  default:
    this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
    local_48._M_p = &stack0xffffffffffffffc8;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xffffffffffffffb8,
               "Unsupported type for deserialization of Constraint!","");
    SerializationException::SerializationException(this_00,(string *)&stack0xffffffffffffffb8);
    __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this->_vptr_Constraint = (_func_int **)local_48._M_p;
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> Constraint::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<ConstraintType>(100, "type");
	unique_ptr<Constraint> result;
	switch (type) {
	case ConstraintType::CHECK:
		result = CheckConstraint::Deserialize(deserializer);
		break;
	case ConstraintType::FOREIGN_KEY:
		result = ForeignKeyConstraint::Deserialize(deserializer);
		break;
	case ConstraintType::NOT_NULL:
		result = NotNullConstraint::Deserialize(deserializer);
		break;
	case ConstraintType::UNIQUE:
		result = UniqueConstraint::Deserialize(deserializer);
		break;
	default:
		throw SerializationException("Unsupported type for deserialization of Constraint!");
	}
	return result;
}